

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexec.c
# Opt level: O0

int onig_get_args_num_by_callout_args(OnigCalloutArgs *args)

{
  CalloutListEntry *pCVar1;
  CalloutListEntry *e;
  int num;
  OnigCalloutArgs *args_local;
  
  pCVar1 = onig_reg_callout_list_at(args->regex,args->num);
  if (pCVar1 == (CalloutListEntry *)0x0) {
    args_local._4_4_ = -0x1e;
  }
  else if (pCVar1->of == ONIG_CALLOUT_OF_NAME) {
    args_local._4_4_ = (pCVar1->u).arg.num;
  }
  else {
    args_local._4_4_ = -0x1e;
  }
  return args_local._4_4_;
}

Assistant:

extern int
onig_get_args_num_by_callout_args(OnigCalloutArgs* args)
{
  int num;
  CalloutListEntry* e;

  num = args->num;
  e = onig_reg_callout_list_at(args->regex, num);
  if (IS_NULL(e)) return ONIGERR_INVALID_ARGUMENT;
  if (e->of == ONIG_CALLOUT_OF_NAME) {
    return e->u.arg.num;
  }

  return ONIGERR_INVALID_ARGUMENT;
}